

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
reset<std::__cxx11::istringstream&>
          (basic_bson_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          error_code *ec)

{
  char cVar1;
  
  basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  reset<std::__cxx11::istringstream&>
            ((basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             (this + 8),source);
  basic_staj_visitor<char>::reset((basic_staj_visitor<char> *)(this + 0x238));
  this[0x298] = (basic_bson_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)0x0;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 != '\0') {
    return;
  }
  (**(code **)(*(long *)this + 0x40))(this,ec);
  return;
}

Assistant:

void reset(Sourceable&& source, std::error_code& ec)
    {
        parser_.reset(std::forward<Sourceable>(source));
        cursor_visitor_.reset();
        eof_ = false;
        if (!done())
        {
            next(ec);
        }
    }